

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecificationElement.h
# Opt level: O0

void __thiscall
DIS::RecordSpecificationElement::RecordSpecificationElement
          (RecordSpecificationElement *this,RecordSpecificationElement *param_1)

{
  uint uVar1;
  unsigned_short uVar2;
  RecordSpecificationElement *param_1_local;
  RecordSpecificationElement *this_local;
  
  this->_vptr_RecordSpecificationElement = (_func_int **)&PTR__RecordSpecificationElement_00268b30;
  uVar1 = param_1->_recordSetSerialNumber;
  this->_recordID = param_1->_recordID;
  this->_recordSetSerialNumber = uVar1;
  uVar2 = param_1->_recordCount;
  this->_recordLength = param_1->_recordLength;
  this->_recordCount = uVar2;
  this->_recordValues = param_1->_recordValues;
  this->_pad4 = param_1->_pad4;
  return;
}

Assistant:

class OPENDIS7_EXPORT RecordSpecificationElement
{
protected:
  /** the data structure used to convey the parameter values of the record for each record. 32 bit enumeration. */
  unsigned int _recordID; 

  /** the serial number of the first record in the block of records */
  unsigned int _recordSetSerialNumber; 

  /**  the length, in bits, of the record. Note, bits, not bytes. */
  unsigned short _recordLength; 

  /**  the number of records included in the record set  */
  unsigned short _recordCount; 

  /** the concatenated records of the format specified by the Record ID field. The length of this field is the Record Length multiplied by the Record Count, in units of bits. ^^^This is wrong--variable sized data records, bit values. THis MUST be patched after generation. */
  unsigned short _recordValues; 

  /** Padding of 0 to 31 unused bits as required for 32-bit alignment of the Record Set field. ^^^This is wrong--variable sized padding. MUST be patched post-code generation */
  unsigned char _pad4; 


 public:
    RecordSpecificationElement();
    virtual ~RecordSpecificationElement();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned int getRecordID() const; 
    void setRecordID(unsigned int pX); 

    unsigned int getRecordSetSerialNumber() const; 
    void setRecordSetSerialNumber(unsigned int pX); 

    unsigned short getRecordLength() const; 
    void setRecordLength(unsigned short pX); 

    unsigned short getRecordCount() const; 
    void setRecordCount(unsigned short pX); 

    unsigned short getRecordValues() const; 
    void setRecordValues(unsigned short pX); 

    unsigned char getPad4() const; 
    void setPad4(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const RecordSpecificationElement& rhs) const;
}